

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O3

void inproc_pipe_close(void *arg)

{
  long lVar1;
  
  lVar1 = *(long *)((long)arg + 8);
  nni_mtx_lock((nni_mtx *)(lVar1 + 0x48));
  *(undefined1 *)(lVar1 + 0x70) = 1;
  inproc_queue_run_closed((inproc_queue *)(lVar1 + 0x18));
  nni_mtx_unlock((nni_mtx *)(lVar1 + 0x48));
  nni_mtx_lock((nni_mtx *)(lVar1 + 0xa8));
  *(undefined1 *)(lVar1 + 0xd0) = 1;
  inproc_queue_run_closed((inproc_queue *)(lVar1 + 0x78));
  nni_mtx_unlock((nni_mtx *)(lVar1 + 0xa8));
  return;
}

Assistant:

static void
inproc_pipe_close(void *arg)
{
	inproc_pipe *pipe = arg;
	inproc_pair *pair = pipe->pair;

	for (int i = 0; i < 2; i++) {
		inproc_queue *queue = &pair->queues[i];
		nni_mtx_lock(&queue->lock);
		queue->closed = true;
		inproc_queue_run_closed(queue);
		nni_mtx_unlock(&queue->lock);
	}
}